

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall FSliderItem::DrawSlider(FSliderItem *this,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int cur;
  int range;
  int y_local;
  int x_local;
  FSliderItem *this_local;
  
  iVar1 = this->mMaxrange;
  iVar2 = this->mMinrange;
  iVar3 = this->mSelection;
  iVar4 = this->mMinrange;
  iVar5 = (x + -0xa0) * CleanXfac;
  iVar6 = DCanvas::GetWidth((DCanvas *)screen);
  iVar5 = iVar5 + iVar6 / 2;
  iVar7 = (y + -100) * CleanYfac;
  iVar6 = DCanvas::GetHeight((DCanvas *)screen);
  iVar7 = iVar7 + iVar6 / 2;
  DCanvas::DrawText((DCanvas *)screen,ConFont,9,iVar5,iVar7,
                    "\x10\x11\x11\x11\x11\x11\x11\x11\x11\x11\x11\x12",0x400013b8,CleanXfac << 3,
                    0x400013b9,CleanYfac << 3,0);
  DCanvas::DrawText((DCanvas *)screen,ConFont,8,
                    iVar5 + (((iVar3 - iVar4) * 0x4e) / (iVar1 - iVar2) + 5) * CleanXfac,iVar7,
                    "\x13",0x400013b8,CleanXfac << 3,0x400013b9,CleanYfac << 3,0);
  return;
}

Assistant:

void FSliderItem::DrawSlider (int x, int y)
{
	int range = mMaxrange - mMinrange;
	int cur = mSelection - mMinrange;

	x = (x - 160) * CleanXfac + screen->GetWidth() / 2;
	y = (y - 100) * CleanYfac + screen->GetHeight() / 2;

	screen->DrawText (ConFont, CR_WHITE, x, y,
		"\x10\x11\x11\x11\x11\x11\x11\x11\x11\x11\x11\x12",
		DTA_CellX, 8 * CleanXfac,
		DTA_CellY, 8 * CleanYfac,
		TAG_DONE);
	screen->DrawText (ConFont, CR_ORANGE, x + (5 + (int)((cur * 78) / range)) * CleanXfac, y,
		"\x13",
		DTA_CellX, 8 * CleanXfac,
		DTA_CellY, 8 * CleanYfac,
		TAG_DONE);
}